

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

bool __thiscall re2::CharClassBuilder::AddRange(CharClassBuilder *this,Rune lo,Rune hi)

{
  _Rb_tree_header *p_Var1;
  RuneRangeSet *this_00;
  _Base_ptr p_Var2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  int iVar8;
  _Base_ptr p_Var9;
  const_iterator cVar10;
  RuneRange local_30;
  
  if (hi < lo) {
    return false;
  }
  if (0x40 < hi && lo < 0x7b) {
    iVar4 = 0x41;
    if (0x41 < lo) {
      iVar4 = lo;
    }
    iVar8 = 0x5a;
    if (hi < 0x5a) {
      iVar8 = hi;
    }
    if (iVar4 <= iVar8) {
      this->upper_ = this->upper_ |
                     ~(-1 << (((char)iVar8 - (char)iVar4) + 1U & 0x1f)) <<
                     ((char)iVar4 + 0xbfU & 0x1f);
    }
    iVar4 = 0x61;
    if (0x61 < lo) {
      iVar4 = lo;
    }
    iVar8 = 0x7a;
    if (hi < 0x7a) {
      iVar8 = hi;
    }
    if (iVar4 <= iVar8) {
      this->lower_ = this->lower_ |
                     ~(-1 << (((char)iVar8 - (char)iVar4) + 1U & 0x1f)) <<
                     ((char)iVar4 + 0x9fU & 0x1f);
    }
  }
  p_Var1 = &(this->ranges_)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = p_Var6;
  p_Var7 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(int *)&p_Var2[1].field_0x4 < lo]) {
    if (lo <= *(int *)&p_Var2[1].field_0x4) {
      p_Var7 = p_Var2;
    }
  }
  p_Var9 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var9 = p_Var7, lo < (int)p_Var7[1]._M_color)) {
    p_Var9 = &p_Var1->_M_header;
  }
  if ((((_Rb_tree_header *)p_Var9 == p_Var1) || (lo < (int)p_Var9[1]._M_color)) ||
     (*(int *)&p_Var9[1].field_0x4 < hi)) {
    this_00 = &this->ranges_;
    if (0 < lo) {
      p_Var7 = &p_Var1->_M_header;
      if (p_Var6 != (_Base_ptr)0x0) {
        do {
          if (lo + -1 <= *(int *)&p_Var6[1].field_0x4) {
            p_Var7 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(int *)&p_Var6[1].field_0x4 < lo + -1];
        } while (p_Var6 != (_Base_ptr)0x0);
      }
      cVar10._M_node = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (cVar10._M_node = p_Var7, lo <= (int)p_Var7[1]._M_color)) {
        cVar10._M_node = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)cVar10._M_node != p_Var1) {
        lo = cVar10._M_node[1]._M_color;
        uVar5 = *(uint *)&cVar10._M_node[1].field_0x4;
        if (hi < (int)uVar5) {
          hi = uVar5;
        }
        this->nrunes_ = this->nrunes_ + ~uVar5 + lo;
        std::
        _Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
        ::erase_abi_cxx11_((_Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
                            *)this_00,cVar10);
      }
    }
    if (0x10fffe < hi) goto LAB_001bd5fd;
    p_Var6 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(int *)&p_Var6[1].field_0x4 <= hi]
        ) {
      if (hi < *(int *)&p_Var6[1].field_0x4) {
        p_Var7 = p_Var6;
      }
    }
    cVar10._M_node = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
       (cVar10._M_node = p_Var7, (int)(hi + 1U) < (int)p_Var7[1]._M_color)) {
      cVar10._M_node = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)cVar10._M_node == p_Var1) goto LAB_001bd5fd;
    hi = *(Rune *)&cVar10._M_node[1].field_0x4;
    uVar5 = hi;
    while( true ) {
      this->nrunes_ = this->nrunes_ + ~uVar5 + cVar10._M_node[1]._M_color;
      std::
      _Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
      ::erase_abi_cxx11_((_Rb_tree<re2::RuneRange,re2::RuneRange,std::_Identity<re2::RuneRange>,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
                          *)this_00,cVar10);
LAB_001bd5fd:
      p_Var6 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      for (; p_Var6 != (_Base_ptr)0x0;
          p_Var6 = (&p_Var6->_M_left)[*(int *)&p_Var6[1].field_0x4 < lo]) {
        if (lo <= *(int *)&p_Var6[1].field_0x4) {
          p_Var7 = p_Var6;
        }
      }
      cVar10._M_node = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (cVar10._M_node = p_Var7, hi < (int)p_Var7[1]._M_color)) {
        cVar10._M_node = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)cVar10._M_node == p_Var1) break;
      uVar5 = *(uint *)&cVar10._M_node[1].field_0x4;
    }
    this->nrunes_ = this->nrunes_ + (hi - lo) + 1;
    local_30.lo = lo;
    local_30.hi = hi;
    std::
    _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
    ::_M_insert_unique<re2::RuneRange>(&this_00->_M_t,&local_30);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CharClassBuilder::AddRange(Rune lo, Rune hi) {
  if (hi < lo)
    return false;

  if (lo <= 'z' && hi >= 'A') {
    // Overlaps some alpha, maybe not all.
    // Update bitmaps telling which ASCII letters are in the set.
    Rune lo1 = std::max<Rune>(lo, 'A');
    Rune hi1 = std::min<Rune>(hi, 'Z');
    if (lo1 <= hi1)
      upper_ |= ((1 << (hi1 - lo1 + 1)) - 1) << (lo1 - 'A');

    lo1 = std::max<Rune>(lo, 'a');
    hi1 = std::min<Rune>(hi, 'z');
    if (lo1 <= hi1)
      lower_ |= ((1 << (hi1 - lo1 + 1)) - 1) << (lo1 - 'a');
  }

  {  // Check whether lo, hi is already in the class.
    iterator it = ranges_.find(RuneRange(lo, lo));
    if (it != end() && it->lo <= lo && hi <= it->hi)
      return false;
  }

  // Look for a range abutting lo on the left.
  // If it exists, take it out and increase our range.
  if (lo > 0) {
    iterator it = ranges_.find(RuneRange(lo-1, lo-1));
    if (it != end()) {
      lo = it->lo;
      if (it->hi > hi)
        hi = it->hi;
      nrunes_ -= it->hi - it->lo + 1;
      ranges_.erase(it);
    }
  }

  // Look for a range abutting hi on the right.
  // If it exists, take it out and increase our range.
  if (hi < Runemax) {
    iterator it = ranges_.find(RuneRange(hi+1, hi+1));
    if (it != end()) {
      hi = it->hi;
      nrunes_ -= it->hi - it->lo + 1;
      ranges_.erase(it);
    }
  }

  // Look for ranges between lo and hi.  Take them out.
  // This is only safe because the set has no overlapping ranges.
  // We've already removed any ranges abutting lo and hi, so
  // any that overlap [lo, hi] must be contained within it.
  for (;;) {
    iterator it = ranges_.find(RuneRange(lo, hi));
    if (it == end())
      break;
    nrunes_ -= it->hi - it->lo + 1;
    ranges_.erase(it);
  }

  // Finally, add [lo, hi].
  nrunes_ += hi - lo + 1;
  ranges_.insert(RuneRange(lo, hi));
  return true;
}